

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bompiprobe.c
# Opt level: O0

int measure_lincost(int pid,int nprocs,int repeat,int msg_size,int total_size,int min_niters,
                   int niters,int ncomms,conf_interval_method_t conf_interval_method,int *n_samples,
                   char *sample_file_name,double *alpha_msg,double *alpha_msg_min,
                   double *alpha_msg_max,double *alpha_rma,double *alpha_rma_min,
                   double *alpha_rma_max,double *beta_msg,double *beta_msg_min,double *beta_msg_max,
                   double *beta_rma,double *beta_rma_min,double *beta_rma_max,double *beta_memcpy,
                   double *beta_memcpy_min,double *beta_memcpy_max,double conf_level)

{
  int size_00;
  int iVar1;
  MPI_Comm comm_00;
  int iVar2;
  MPI_Request *reqs_00;
  void *data;
  void *__ptr;
  undefined8 *__ptr_00;
  double dVar3;
  double dVar4;
  undefined8 in_stack_fffffffffffffe48;
  byte local_181;
  MPI_Win win;
  MPI_Comm comm;
  int size;
  int h;
  double t;
  double t1;
  double t0;
  FILE *sample_file;
  double T_max [6];
  double T_min [6];
  double T [6];
  int o [7];
  int max_h;
  int n_avgs;
  MPI_Comm *comms;
  MPI_Win *wins;
  int *pid_perms;
  MPI_Request *reqs;
  int glob_error;
  int my_error;
  int k;
  int i;
  size_t rng;
  lincost_sample_t *samples;
  char *recvbuf;
  char *sendbuf;
  double conf_level_local;
  int local_30;
  int min_niters_local;
  int total_size_local;
  int msg_size_local;
  int repeat_local;
  int nprocs_local;
  int pid_local;
  
  _k = 0;
  reqs._4_4_ = 0;
  reqs._0_4_ = 0;
  iVar2 = total_size / msg_size;
  *n_samples = 0;
  sendbuf = (char *)conf_level;
  conf_level_local._4_4_ = min_niters;
  local_30 = total_size;
  min_niters_local = msg_size;
  total_size_local = repeat;
  msg_size_local = nprocs;
  repeat_local = pid;
  if ((pid == 0) && (sample_file_name != (char *)0x0)) {
    t0 = (double)fopen(sample_file_name,"w");
    if ((FILE *)t0 != (FILE *)0x0) {
      fprintf((FILE *)t0,"#ID\tSTAMP\tMETHOD\tTOPOLOGY\tMSG_SIZE\tH_REL\tTIME\n");
    }
    reqs._4_4_ = (uint)((FILE *)t0 == (FILE *)0x0);
  }
  else {
    t0 = 0.0;
    reqs._4_4_ = 0;
  }
  MPI_Allreduce((long)&reqs + 4,&reqs,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
  if ((int)reqs == 0) {
    recvbuf = (char *)calloc((long)(local_30 << 1),1);
    samples = (lincost_sample_t *)calloc((long)(local_30 << 1),1);
    rng = (size_t)calloc((long)niters,0x28);
    reqs_00 = (MPI_Request *)calloc((long)(iVar2 << 1),8);
    data = calloc((long)msg_size_local,4);
    __ptr = calloc((long)ncomms,8);
    __ptr_00 = (undefined8 *)calloc((long)ncomms,8);
    if (__ptr_00 != (undefined8 *)0x0) {
      for (my_error = 0; my_error < ncomms; my_error = my_error + 1) {
        __ptr_00[my_error] = &ompi_mpi_comm_null;
      }
    }
    if (__ptr != (void *)0x0) {
      for (my_error = 0; my_error < ncomms; my_error = my_error + 1) {
        *(undefined **)((long)__ptr + (long)my_error * 8) = &ompi_mpi_win_null;
      }
    }
    local_181 = 1;
    if ((((recvbuf != (char *)0x0) && (local_181 = 1, samples != (lincost_sample_t *)0x0)) &&
        (local_181 = 1, rng != 0)) &&
       (((local_181 = 1, reqs_00 != (MPI_Request *)0x0 && (local_181 = 1, data != (void *)0x0)) &&
        (local_181 = 1, __ptr != (void *)0x0)))) {
      local_181 = __ptr_00 != (undefined8 *)0x0 ^ 0xff;
    }
    reqs._4_4_ = (uint)(local_181 & 1);
    MPI_Allreduce((long)&reqs + 4,&reqs,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
    if ((int)reqs == 0) {
      memset(recvbuf,1,(long)(local_30 << 1));
      memset(samples,2,(long)(local_30 << 1));
      for (my_error = 0; my_error < msg_size_local; my_error = my_error + 1) {
        *(int *)((long)data + (long)my_error * 4) = my_error;
      }
      MPI_Comm_dup(&ompi_mpi_comm_world,__ptr_00);
      MPI_Win_create(samples,(long)(local_30 << 1),1,&ompi_mpi_info_null,*__ptr_00,__ptr);
      for (my_error = 1; my_error < ncomms; my_error = my_error + 1) {
        permute((size_t *)&k,data,msg_size_local,4);
        MPI_Comm_split(*__ptr_00,0,*(undefined4 *)((long)data + (long)repeat_local * 4),
                       __ptr_00 + my_error);
        MPI_Win_create(samples,(long)(local_30 << 1),1,&ompi_mpi_info_null,__ptr_00[my_error],
                       (void *)((long)__ptr + (long)my_error * 8));
      }
      for (my_error = 0; my_error < niters; my_error = my_error + 1) {
        *(int *)(rng + (long)my_error * 0x28 + 0xc) = (my_error % 2 + 1) * min_niters_local;
      }
      permute((size_t *)&k,(void *)rng,niters,0x28);
      for (my_error = 0; my_error < niters; my_error = my_error + 1) {
        *(int *)(rng + (long)my_error * 0x28 + 8) = my_error % (iVar2 + 1);
      }
      permute((size_t *)&k,(void *)rng,niters,0x28);
      for (my_error = 0; my_error < niters; my_error = my_error + 1) {
        *(int *)(rng + (long)my_error * 0x28 + 0x10) = my_error % ncomms;
      }
      permute((size_t *)&k,(void *)rng,niters,0x28);
      for (my_error = 0; my_error < niters; my_error = my_error + 1) {
        *(int *)(rng + (long)my_error * 0x28 + 0x14) = my_error % 3;
      }
      permute((size_t *)&k,(void *)rng,niters,0x28);
      for (my_error = 0; my_error < ncomms; my_error = my_error + 1) {
        in_stack_fffffffffffffe48 =
             CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),total_size_local);
        measure_hrel_msg((MPI_Comm)__ptr_00[my_error],recvbuf,(char *)samples,reqs_00,iVar2,
                         min_niters_local << 1,total_size_local);
        measure_hrel_rma((MPI_Comm)__ptr_00[my_error],*(MPI_Win *)((long)__ptr + (long)my_error * 8)
                         ,recvbuf,iVar2,min_niters_local << 1,total_size_local);
        measure_hrel_memcpy((MPI_Comm)__ptr_00[my_error],recvbuf,(char *)samples,iVar2,
                            min_niters_local << 1,total_size_local);
      }
      dVar3 = bsp_time();
      t = dVar3;
      for (my_error = 0; my_error < niters; my_error = my_error + 1) {
        _size = INFINITY;
        iVar2 = *(int *)(rng + 8 + (long)my_error * 0x28);
        size_00 = *(int *)(rng + 0xc + (long)my_error * 0x28);
        comm_00 = (MPI_Comm)__ptr_00[*(int *)(rng + 0x10 + (long)my_error * 0x28)];
        iVar1 = *(int *)(rng + 0x14 + (long)my_error * 0x28);
        if (iVar1 == 0) {
          _size = measure_hrel_rma(comm_00,*(MPI_Win *)
                                            ((long)__ptr +
                                            (long)*(int *)(rng + 0x10 + (long)my_error * 0x28) * 8),
                                   recvbuf,iVar2,size_00,total_size_local);
        }
        else if (iVar1 == 1) {
          in_stack_fffffffffffffe48 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),total_size_local);
          _size = measure_hrel_msg(comm_00,recvbuf,(char *)samples,reqs_00,iVar2,size_00,
                                   total_size_local);
        }
        else if (iVar1 == 2) {
          _size = measure_hrel_memcpy(comm_00,recvbuf,(char *)samples,iVar2,size_00,total_size_local
                                     );
        }
        *(double *)(rng + (long)my_error * 0x28) = _size;
        dVar4 = bsp_time();
        *(double *)(rng + (long)my_error * 0x28 + 0x20) = dVar4 - dVar3;
        *(int *)(rng + (long)my_error * 0x28 + 0x18) = my_error;
        if ((repeat_local == 0) && (dVar4 = bsp_time(), 10.0 < dVar4 - t)) {
          dVar4 = bsp_time();
          printf("# Sample time remaining: %.0f seconds\n#    (Press CTRL+C to interrupt)\n",
                 ((dVar4 - dVar3) / (double)my_error) * (double)((niters - my_error) + -1));
          t = bsp_time();
        }
        MPI_Allreduce(&s_interrupted,&reqs,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
        if ((int)reqs != 0) {
          if (my_error <= conf_level_local._4_4_) goto LAB_001193b7;
          niters = my_error;
          break;
        }
      }
      if (t0 != 0.0) {
        for (my_error = 0; my_error < niters; my_error = my_error + 1) {
          in_stack_fffffffffffffe48 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                        *(undefined4 *)(rng + (long)my_error * 0x28 + 8));
          fprintf((FILE *)t0,"%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                  *(undefined8 *)(rng + (long)my_error * 0x28 + 0x20),
                  *(undefined8 *)(rng + (long)my_error * 0x28),
                  (ulong)*(uint *)(rng + (long)my_error * 0x28 + 0x18),
                  (ulong)*(uint *)(rng + (long)my_error * 0x28 + 0x14),
                  (ulong)*(uint *)(rng + (long)my_error * 0x28 + 0x10),
                  (ulong)*(uint *)(rng + (long)my_error * 0x28 + 0xc),in_stack_fffffffffffffe48);
        }
        fclose((FILE *)t0);
      }
      qsort((void *)rng,(long)niters,0x28,cmp_lincost_sample);
      T[5]._0_4_ = 0;
      my_error = 0;
      for (glob_error = 0; glob_error < 6; glob_error = glob_error + 1) {
        while (((my_error < niters &&
                (*(int *)(rng + (long)my_error * 0x28 + 0xc) ==
                 (glob_error % 2 + 1) * min_niters_local)) &&
               (*(int *)(rng + (long)my_error * 0x28 + 0x14) == glob_error / 2))) {
          my_error = my_error + 1;
        }
        o[(long)(glob_error + 1) + -2] = my_error;
      }
      reqs._4_4_ = (*conf_interval_method)
                             ((size_t *)&k,(void *)rng,0x28,lincost_samples_get_hrel_time,
                              (int *)(T + 5),6,(double)sendbuf,(int)(10.0 / (1.0 - conf_level)),
                              T_min + 5,T_max + 5,(double *)&sample_file);
      MPI_Allreduce((long)&reqs + 4,&reqs,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
      if ((int)reqs == 0) {
        *alpha_rma = T_min[5] + T_min[5] + -T[0];
        *alpha_rma_min = T_max[5] + T_max[5] + -T_max[0];
        *alpha_rma_max = (double)sample_file + (double)sample_file + -T_min[0];
        *alpha_msg = T[1] + T[1] + -T[2];
        *alpha_msg_min = T_min[1] + T_min[1] + -T_max[2];
        *alpha_msg_max = T_max[1] + T_max[1] + -T_min[2];
        *beta_rma = (T[0] - T_min[5]) / (double)min_niters_local;
        *beta_rma_min = (T_min[0] - (double)sample_file) / (double)min_niters_local;
        *beta_rma_max = (T_max[0] - T_max[5]) / (double)min_niters_local;
        *beta_msg = (T[2] - T[1]) / (double)min_niters_local;
        *beta_msg_min = (T_min[2] - T_max[1]) / (double)min_niters_local;
        *beta_msg_max = (T_max[2] - T_min[1]) / (double)min_niters_local;
        *beta_memcpy = (T[4] - T[3]) / (double)min_niters_local;
        *beta_memcpy_min = (T_min[4] - T_max[3]) / (double)min_niters_local;
        *beta_memcpy_max = (T_max[4] - T_min[3]) / (double)min_niters_local;
        *n_samples = niters;
      }
    }
    else if (repeat_local == 0) {
      fprintf(_stderr,
              "Insufficient memory. For a benchmark on %d processes I require 2x %d bytes of memory for send and receive buffers, %ld bytes for storing the measurements, %ld bytes for the request queue, %ld bytes for communication infrastructure\n"
              ,(ulong)(uint)msg_size_local,(ulong)(uint)(local_30 << 1),(long)niters * 0x28,
              (long)(iVar2 << 1) << 3,(long)ncomms * 8 + (long)ncomms * 8 + (long)msg_size_local * 4
             );
    }
LAB_001193b7:
    for (my_error = 0; my_error < ncomms; my_error = my_error + 1) {
      if (*(undefined **)((long)__ptr + (long)my_error * 8) != &ompi_mpi_win_null) {
        MPI_Win_free((void *)((long)__ptr + (long)my_error * 8));
      }
      if ((undefined *)__ptr_00[my_error] != &ompi_mpi_comm_null) {
        MPI_Comm_free(__ptr_00 + my_error);
      }
    }
    free(recvbuf);
    free(samples);
    free((void *)rng);
    free(reqs_00);
    free(__ptr_00);
    free(data);
    free(__ptr);
    nprocs_local = (int)reqs;
  }
  else {
    if (repeat_local == 0) {
      fprintf(_stderr,"Could not open file \'%s\' for writing sample data\n",sample_file_name);
    }
    nprocs_local = 1;
  }
  return nprocs_local;
}

Assistant:

int measure_lincost( int pid, int nprocs, int repeat,
        int msg_size, int total_size, int min_niters, int niters, int ncomms,
        conf_interval_method_t conf_interval_method,
        int * n_samples, 
        const char * sample_file_name,
        double * alpha_msg, double * alpha_msg_min, double * alpha_msg_max, 
        double * alpha_rma, double * alpha_rma_min, double * alpha_rma_max, 
        double * beta_msg, double * beta_msg_min, double * beta_msg_max,
        double * beta_rma, double * beta_rma_min, double * beta_rma_max,
        double * beta_memcpy, double *beta_memcpy_min, double *beta_memcpy_max,
        double conf_level )
{
    char * sendbuf, * recvbuf;
    lincost_sample_t * samples;
    size_t rng = 0;
    int i, k, my_error=0, glob_error=0;
    MPI_Request * reqs = 0; 
    int * pid_perms;
    MPI_Win * wins;  MPI_Comm * comms;
    const int n_avgs = (int) (10.0 / (1.0 - conf_level));
    const int max_h = total_size / msg_size;
    int o[7];  /* two methods x two msg sizes + 1 */
    double T[6], T_min[6], T_max[6]; /* two methods x two msg sizes */
    FILE * sample_file;
    double t0, t1;

    * n_samples = 0;

    if ( pid == 0 && sample_file_name ) {
        sample_file = fopen( sample_file_name, "w" );
        if (sample_file) {
            fprintf( sample_file, "#ID\tSTAMP\tMETHOD\tTOPOLOGY\t"
                                  "MSG_SIZE\tH_REL\tTIME\n" );
            my_error = 0;
        }
        else {
            my_error = 1;
        }
    }
    else {
        sample_file = NULL;
        my_error = 0;
    }

    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Could not open file '%s' for writing sample data\n",
                sample_file_name );
        return 1;
    }
 

    /* allocate memory */
    sendbuf = calloc( 2* total_size, 1 );
    recvbuf = calloc( 2* total_size, 1 );
    samples =  calloc( niters, sizeof(samples[0]) );
    reqs = calloc( 2*max_h, sizeof(MPI_Request) );
    pid_perms = calloc( nprocs, sizeof(pid_perms[0]) );
    wins = calloc( ncomms, sizeof(MPI_Win) );
    comms = calloc( ncomms, sizeof(MPI_Comm) ); 

    if (comms) {
        for ( i = 0; i < ncomms; ++i )
            comms[i] = MPI_COMM_NULL;
    }
    if (wins) { 
        for ( i = 0; i < ncomms; ++i) 
            wins[i] = MPI_WIN_NULL;
    }

    my_error = !sendbuf || !recvbuf || !samples || !reqs
            || !pid_perms || !wins || !comms;
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Insufficient memory. For a benchmark on "
                "%d processes I require 2x %d bytes of memory "
                "for send and receive buffers, %ld bytes for "
                "storing the measurements, %ld bytes for "
                "the request queue, %ld bytes for "
                "communication infrastructure\n",
                nprocs,  2*total_size,
                (long) niters * (long) sizeof(samples[0]),
                2*max_h * (long) sizeof(MPI_Request),
               ncomms * (long) sizeof(MPI_Win) +
               ncomms * (long) sizeof(MPI_Comm) +
               nprocs * (long) sizeof(pid_perms[0]) );
        goto exit;
    }

    memset( sendbuf, 1, 2*total_size );
    memset( recvbuf, 2, 2*total_size );

    /* Create random topologies */
    for ( i = 0 ; i < nprocs; ++i )
        pid_perms[i] = i;

    MPI_Comm_dup( MPI_COMM_WORLD, &comms[0] );
    MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[0], & wins[0] );

    for ( i = 1; i < ncomms; ++i ) {
        permute( &rng, pid_perms, nprocs, sizeof(pid_perms[0]) );

        MPI_Comm_split( comms[0], 0, pid_perms[pid], &comms[i] );
        MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[i], & wins[i] );
    }

    /* Create measurement points */
    for ( i = 0 ; i < niters; ++i )
        samples[i].msg_size = (i%2 + 1) * msg_size;

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i ) 
        samples[i].h = i % ( max_h + 1);

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i )
       samples[i].comm = i % ncomms; 

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0 ; i < niters; ++i )
        samples[i].method = i % 3;

    permute( &rng, samples, niters, sizeof(samples[0]) );


    /* Warm up */
    for ( i = 0; i < ncomms; ++i ) {
        measure_hrel_msg( comms[i], sendbuf, recvbuf, reqs, 
                max_h, 2*msg_size, repeat );
        measure_hrel_rma( comms[i], wins[i], sendbuf, 
                max_h, 2*msg_size, repeat );
        measure_hrel_memcpy( comms[i], sendbuf, recvbuf, 
                max_h, 2*msg_size, repeat );
    }

    /* And now the measurements */
    t0 = t1 = bsp_time();
    for ( i = 0; i < niters; ++i ) {
        double t = HUGE_VAL;
        int h    = samples[i].h;
        int size = samples[i].msg_size;
        MPI_Comm comm = comms[ samples[i].comm ];
        MPI_Win win = wins[ samples[i].comm ];

        switch( samples[i].method ) {
            case 0: t = measure_hrel_rma( comm, win, sendbuf, 
                                          h, size, repeat );
                    break;
            case 1: t = measure_hrel_msg( comm, sendbuf, recvbuf, reqs, 
                                          h, size, repeat );
                    break;
            case 2: t = measure_hrel_memcpy( comm, sendbuf, recvbuf,
                                          h, size, repeat );
                    break;
        }

        samples[i].time = t;
        samples[i].timestamp = bsp_time() - t0;
        samples[i].serial = i;

        if ( !pid && bsp_time() - t1 > 10.0 ) {
            printf("# Sample time remaining: %.0f seconds\n"
                   "#    (Press CTRL+C to interrupt)\n",
                    (bsp_time() - t0) / i *(niters - i - 1) );
            t1 = bsp_time();
        }

        MPI_Allreduce( &s_interrupted, &glob_error, 1, MPI_INT,
                MPI_MAX, MPI_COMM_WORLD );
        if ( glob_error ) { 
            if (i > min_niters) {
                niters = i;
                break;
            }
            else {
                goto exit;
            }
        }
    } 

    /* Saving data */
    if (sample_file) {
        for ( i = 0; i < niters; ++i ) {
            fprintf( sample_file, 
                      "%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                      samples[i].serial, samples[i].timestamp,
                      samples[i].method, samples[i].comm,
                      samples[i].msg_size, samples[i].h, samples[i].time );
        }
        fclose( sample_file );
        sample_file = NULL;
    }

    /* Analysis */

    /* sort on (msg_size, method) */
    qsort( samples, niters, sizeof(samples[0]), cmp_lincost_sample );
    
    /* create an index to each (msg_size, method) in array 'o' */
    o[0] = 0;
    i = 0;
    for ( k = 0; k < 6; ++k ) {
        for ( ; i < niters; ++i )
            if (samples[i].msg_size != (k%2+1)*msg_size
                || samples[i].method != (k/2) )
                break;

        o[k+1] = i;
    }
 
    my_error = (*conf_interval_method)( &rng, samples, sizeof(samples[0]), 
           lincost_samples_get_hrel_time, 
           o, 6, conf_level, n_avgs,
           T, T_min, T_max );
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if (glob_error) {
        goto exit;
    }
   
    /* saving results */
    *alpha_rma     = 2*T[0] - T[1];
    *alpha_rma_min = 2*T_min[0] - T_max[1];
    *alpha_rma_max = 2*T_max[0] - T_min[1];

    *alpha_msg     = 2*T[2] - T[3];
    *alpha_msg_min = 2*T_min[2] - T_max[3];
    *alpha_msg_max = 2*T_max[2] - T_min[3];

    *beta_rma = (T[1] - T[0])/msg_size ;
    *beta_rma_min = (T_min[1] - T_max[0])/msg_size;
    *beta_rma_max = (T_max[1] - T_min[0])/msg_size;

    *beta_msg = (T[3] - T[2])/msg_size ;
    *beta_msg_min = (T_min[3] - T_max[2])/msg_size;
    *beta_msg_max = (T_max[3] - T_min[2])/msg_size;

    *beta_memcpy = (T[5] - T[4])/msg_size ;
    *beta_memcpy_min = (T_min[5] - T_max[4])/msg_size;
    *beta_memcpy_max = (T_max[5] - T_min[4])/msg_size;

    *n_samples = niters;

exit:
    /* free resources */
    for ( i = 0; i < ncomms; ++i ) {
        if (wins[i] != MPI_WIN_NULL)
            MPI_Win_free( &wins[i] );

        if (comms[i] != MPI_COMM_NULL )
            MPI_Comm_free( &comms[i] );
    }

    free( sendbuf );
    free( recvbuf );
    free( samples );
    free( reqs );
    free( comms );
    free( pid_perms );
    free( wins );
    
    return glob_error;
}